

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper4.cpp
# Opt level: O1

planck_unit_suite_t * cpp_wrapper4_getsuite_2(void)

{
  planck_unit_suite_t *suite;
  
  suite = planck_unit_new_suite();
  planck_unit_add_to_suite
            (suite,test_static_equality_all,"test_static_equality_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_static_range_all_all,"test_static_range_all_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_static_all_records_random_all,"test_static_all_records_random_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_static_open_close_all,"test_static_open_close_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_static_create_open_close_all,"test_static_create_open_close_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_static_open_close_complex_all,"test_static_open_close_complex_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
            );
  return suite;
}

Assistant:

planck_unit_suite_t *
cpp_wrapper4_getsuite_2(
) {
	planck_unit_suite_t *suite = planck_unit_new_suite();

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_static_equality_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_static_range_all_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_static_all_records_random_all);

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_static_open_close_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_static_create_open_close_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_static_open_close_complex_all);

	return suite;
}